

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O3

int PHF::init<unsigned_long,true>
              (phf *phf,unsigned_long *k,size_t n,size_t l,size_t a,phf_seed_t seed)

{
  long *plVar1;
  undefined8 *puVar2;
  ulong *puVar3;
  unsigned_long uVar4;
  long lVar5;
  ulong uVar6;
  byte bVar7;
  int iVar8;
  ulong uVar9;
  undefined8 *__base;
  void *__ptr;
  uint32_t *puVar10;
  int *piVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  size_t sVar15;
  long *plVar16;
  size_t sVar17;
  undefined8 *puVar18;
  uint uVar19;
  size_t __nmemb;
  int iVar20;
  undefined8 *puVar21;
  undefined8 *puVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  void *local_58;
  
  uVar26 = n + (n == 0);
  uVar14 = l + (l == 0);
  sVar15 = 100;
  if (a < 100) {
    sVar15 = a;
  }
  phf->nodiv = true;
  if (uVar26 <= uVar14) {
    uVar14 = uVar26;
  }
  uVar14 = uVar26 / uVar14 - 1;
  uVar14 = uVar14 >> 1 | uVar14;
  uVar14 = uVar14 >> 2 | uVar14;
  uVar14 = uVar14 >> 4 | uVar14;
  uVar14 = uVar14 >> 8 | uVar14;
  uVar14 = uVar14 >> 0x10 | uVar14;
  uVar9 = (uVar26 * 100) / (sVar15 + (sVar15 == 0)) - 1;
  uVar9 = uVar9 >> 1 | uVar9;
  uVar9 = uVar9 >> 2 | uVar9;
  uVar9 = uVar9 >> 4 | uVar9;
  uVar9 = uVar9 >> 8 | uVar9;
  uVar9 = uVar9 >> 0x10 | uVar9;
  uVar9 = uVar9 >> 0x20 | uVar9;
  sVar15 = uVar9 + 1;
  __nmemb = (uVar14 >> 0x20 | uVar14) + 1;
  if (__nmemb == 0) {
    return 0x22;
  }
  if (sVar15 == 0) {
    return 0x22;
  }
  __base = (undefined8 *)calloc(uVar26,0x18);
  if ((__base == (undefined8 *)0x0) || (local_58 = calloc(__nmemb,8), local_58 == (void *)0x0)) {
    __ptr = (void *)0x0;
    local_58 = (void *)0x0;
  }
  else {
    if (n != 0) {
      plVar16 = __base + 2;
      sVar17 = 0;
      do {
        uVar4 = k[sVar17];
        uVar19 = ((uint)((int)uVar4 * -0x3361d2af) >> 0x11 | (int)uVar4 * 0x16a88000) * 0x1b873593 ^
                 seed;
        iVar20 = (int)(uVar4 >> 0x20);
        uVar19 = ((uint)(iVar20 * -0x3361d2af) >> 0x11 | iVar20 * 0x16a88000) * 0x1b873593 ^
                 (uVar19 << 0xd | uVar19 >> 0x13) * 5 + 0xe6546b64;
        plVar16[-2] = uVar4;
        uVar19 = (uVar19 << 0xd | uVar19 >> 0x13) * 5 + 0xe6546b64;
        uVar19 = (uVar19 >> 0x10 ^ uVar19) * -0x7a143595;
        uVar19 = (uVar19 >> 0xd ^ uVar19) * -0x3d4d51cb;
        uVar19 = (uVar19 >> 0x10 ^ uVar19) & (int)__nmemb - 1U;
        *(uint *)(plVar16 + -1) = uVar19;
        plVar1 = (long *)((long)local_58 + (ulong)uVar19 * 8);
        *plVar1 = *plVar1 + 1;
        *plVar16 = (long)((long)local_58 + (ulong)uVar19 * 8);
        sVar17 = sVar17 + 1;
        plVar16 = plVar16 + 3;
      } while (n != sVar17);
    }
    qsort(__base,uVar26,0x18,phf_keycmp<unsigned_long>);
    uVar14 = uVar9 + 0x40 >> 6;
    __ptr = calloc(uVar14 * 2,8);
    if (__ptr == (void *)0x0) {
      __ptr = (void *)0x0;
    }
    else {
      puVar10 = (uint32_t *)calloc(__nmemb,4);
      if (puVar10 != (uint32_t *)0x0) {
        iVar20 = 0;
        if ((long)n < 1) {
          uVar26 = 0;
        }
        else {
          uVar19 = (int)sVar15 - 1;
          uVar26 = 0;
          puVar18 = __base;
          do {
            lVar5 = *(long *)puVar18[2];
            if (lVar5 == 0) break;
            puVar2 = puVar18 + lVar5 * 3;
            if (0 < lVar5) {
              uVar9 = 1;
              do {
                iVar8 = (int)uVar9;
                uVar12 = ((uint)(iVar8 * -0x3361d2af) >> 0x11 | iVar8 * 0x16a88000) * 0x1b873593 ^
                         seed;
                uVar12 = (uVar12 << 0xd | uVar12 >> 0x13) * 5 + 0xe6546b64;
                puVar21 = puVar18;
                while( true ) {
                  iVar13 = (int)*puVar21;
                  uVar24 = ((uint)(iVar13 * -0x3361d2af) >> 0x11 | iVar13 * 0x16a88000) * 0x1b873593
                           ^ uVar12;
                  iVar13 = (int)((ulong)*puVar21 >> 0x20);
                  uVar24 = ((uint)(iVar13 * -0x3361d2af) >> 0x11 | iVar13 * 0x16a88000) * 0x1b873593
                           ^ (uVar24 << 0xd | uVar24 >> 0x13) * 5 + 0xe6546b64;
                  uVar24 = (uVar24 << 0xd | uVar24 >> 0x13) * 5 + 0xe6546b64;
                  uVar24 = (uVar24 >> 0x10 ^ uVar24) * -0x7a143595;
                  uVar24 = (uVar24 >> 0xd ^ uVar24) * -0x3d4d51cb;
                  uVar24 = (uVar24 >> 0x10 ^ uVar24) & uVar19;
                  uVar23 = (ulong)(uVar24 >> 6);
                  uVar25 = 1L << ((byte)uVar24 & 0x3f);
                  puVar22 = puVar18;
                  if (((*(ulong *)((long)__ptr + uVar23 * 8) >> ((ulong)uVar24 & 0x3f) & 1) != 0) ||
                     (uVar6 = *(ulong *)((long)__ptr + uVar23 * 8 + uVar14 * 8),
                     (uVar6 & uVar25) != 0)) break;
                  *(ulong *)((long)__ptr + uVar23 * 8 + uVar14 * 8) = uVar6 | uVar25;
                  puVar21 = puVar21 + 3;
                  if (puVar2 <= puVar21) {
                    if (0 < lVar5) {
                      uVar12 = ((uint)(iVar8 * -0x3361d2af) >> 0x11 | iVar8 * 0x16a88000) *
                               0x1b873593 ^ seed;
                      puVar21 = puVar18;
                      do {
                        iVar8 = (int)*puVar21;
                        uVar24 = ((uint)(iVar8 * -0x3361d2af) >> 0x11 | iVar8 * 0x16a88000) *
                                 0x1b873593 ^ (uVar12 << 0xd | uVar12 >> 0x13) * 5 + 0xe6546b64;
                        iVar8 = (int)((ulong)*puVar21 >> 0x20);
                        uVar24 = ((uint)(iVar8 * -0x3361d2af) >> 0x11 | iVar8 * 0x16a88000) *
                                 0x1b873593 ^ (uVar24 << 0xd | uVar24 >> 0x13) * 5 + 0xe6546b64;
                        uVar24 = (uVar24 << 0xd | uVar24 >> 0x13) * 5 + 0xe6546b64;
                        uVar24 = (uVar24 >> 0x10 ^ uVar24) * -0x7a143595;
                        uVar24 = (uVar24 >> 0xd ^ uVar24) * -0x3d4d51cb;
                        uVar24 = (uVar24 >> 0x10 ^ uVar24) & uVar19;
                        puVar3 = (ulong *)((long)__ptr + (ulong)(uVar24 >> 6) * 8);
                        *puVar3 = *puVar3 | 1L << ((byte)uVar24 & 0x3f);
                        puVar21 = puVar21 + 3;
                      } while (puVar21 < puVar2);
                    }
                    goto LAB_0011613d;
                  }
                }
                do {
                  iVar8 = (int)*puVar22;
                  uVar24 = ((uint)(iVar8 * -0x3361d2af) >> 0x11 | iVar8 * 0x16a88000) * 0x1b873593 ^
                           uVar12;
                  iVar8 = (int)((ulong)*puVar22 >> 0x20);
                  uVar24 = ((uint)(iVar8 * -0x3361d2af) >> 0x11 | iVar8 * 0x16a88000) * 0x1b873593 ^
                           (uVar24 << 0xd | uVar24 >> 0x13) * 5 + 0xe6546b64;
                  uVar24 = (uVar24 << 0xd | uVar24 >> 0x13) * 5 + 0xe6546b64;
                  uVar24 = (uVar24 >> 0x10 ^ uVar24) * -0x7a143595;
                  uVar24 = (uVar24 >> 0xd ^ uVar24) * -0x3d4d51cb;
                  uVar24 = (uVar24 >> 0x10 ^ uVar24) & uVar19;
                  bVar7 = (byte)uVar24 & 0x3f;
                  puVar3 = (ulong *)((long)__ptr + (ulong)(uVar24 >> 6) * 8 + uVar14 * 8);
                  *puVar3 = *puVar3 & (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
                  puVar22 = puVar22 + 3;
                } while (puVar22 < puVar2);
                uVar9 = uVar9 + 1;
              } while( true );
            }
            uVar9 = 1;
LAB_0011613d:
            uVar26 = uVar26 & 0xffffffff;
            if (uVar26 < uVar9) {
              uVar26 = uVar9;
            }
            puVar10[*(uint *)(puVar18 + 1)] = (uint32_t)uVar9;
            puVar18 = puVar2;
          } while (puVar2 < __base + n * 3);
          uVar26 = uVar26 & 0xffffffff;
        }
        phf->seed = seed;
        phf->r = __nmemb;
        phf->m = sVar15;
        phf->g = puVar10;
        phf->d_max = uVar26;
        phf->g_op = PHF_G_UINT32_BAND_R;
        phf->g_jmp = (void *)0x0;
        goto LAB_00116174;
      }
    }
  }
  piVar11 = __errno_location();
  iVar20 = *piVar11;
LAB_00116174:
  free(__ptr);
  free(local_58);
  free(__base);
  return iVar20;
}

Assistant:

PHF_PUBLIC int PHF::init(struct phf *phf, const key_t k[], const size_t n, const size_t l, const size_t a, const phf_seed_t seed) {
	size_t n1 = PHF_MAX(n, 1); /* for computations that require n > 0 */
	size_t l1 = PHF_MAX(l, 1);
	size_t a1 = PHF_MAX(PHF_MIN(a, 100), 1);
	size_t r; /* number of buckets */
	size_t m; /* size of output array */
	phf_key<key_t> *B_k = NULL; /* linear bucket-slot array */
	size_t *B_z = NULL;         /* number of slots per bucket */
	phf_key<key_t> *B_p, *B_pe;
	phf_bits_t *T = NULL; /* bitmap to track index occupancy */
	phf_bits_t *T_b;      /* per-bucket working bitmap */
	size_t T_n;
	uint32_t *g = NULL; /* displacement map */
	uint32_t d_max = 0; /* maximum displacement value */
	int error;

	if ((phf->nodiv = nodiv)) {
		/* round to power-of-2 so we can use bit masks instead of modulo division */
		r = phf_powerup(n1 / PHF_MIN(l1, n1));
		m = phf_powerup((n1 * 100) / a1);
	} else {
		r = phf_primeup(PHF_HOWMANY(n1, l1));
		/* XXX: should we bother rounding m to prime number for small n? */
		m = phf_primeup((n1 * 100) / a1);
	}

	if (r == 0 || m == 0)
		return ERANGE;

	if (!(B_k = static_cast<phf_key<key_t> *>(calloc(n1, sizeof *B_k))))
		goto syerr;
	if (!(B_z = static_cast<size_t *>(calloc(r, sizeof *B_z))))
		goto syerr;

	for (size_t i = 0; i < n; i++) {
		phf_hash_t g = phf_g_mod_r<nodiv>(k[i], seed, r);

		B_k[i].k = k[i];
		B_k[i].g = g;
		B_k[i].n = &B_z[g];
		++*B_k[i].n;
	}

	qsort(B_k, n1, sizeof *B_k, reinterpret_cast<int(*)(const void *, const void *)>(&phf_keycmp<key_t>));

	T_n = PHF_HOWMANY(m, PHF_BITS(*T));
	if (!(T = static_cast<phf_bits_t *>(calloc(T_n * 2, sizeof *T))))
		goto syerr;
	T_b = &T[T_n]; /* share single allocation */

	/*
	 * FIXME: T_b[] is unnecessary. We could clear T[] the same way we
	 * clear T_b[]. In fact, at the end of generation T_b[] is identical
	 * to T[] because we don't clear T_b[] on success.
	 *
	 * We just need to tweak the current reset logic to stop before the
	 * key that failed, and then we can elide the commit to T[] at the
	 * end of the outer loop.
	 */

	if (!(g = static_cast<uint32_t *>(calloc(r, sizeof *g))))
		goto syerr;

	B_p = B_k;
	B_pe = &B_k[n];

	for (; B_p < B_pe && *B_p->n > 0; B_p += *B_p->n) {
		phf_key<key_t> *Bi_p, *Bi_pe;
		size_t d = 0;
		uint32_t f;
retry:
		d++;
		Bi_p = B_p;
		Bi_pe = B_p + *B_p->n;

		for (; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);

			if (phf_isset(T, f) || phf_isset(T_b, f)) {
				/* reset T_b[] */
				for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
					f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
					phf_clrbit(T_b, f);
				}

				goto retry;
			} else {
				phf_setbit(T_b, f);
			}
		}

		/* commit to T[] */
		for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
			phf_setbit(T, f);
		}

		/* commit to g[] */
		g[B_p->g] = d;
		d_max = PHF_MAX(d, d_max);
	}

	phf->seed = seed;
	phf->r = r;
	phf->m = m;

	phf->g = g;
	g = NULL;

	phf->d_max = d_max;
	phf->g_op = (nodiv)? phf::PHF_G_UINT32_BAND_R : phf::PHF_G_UINT32_MOD_R;
	phf->g_jmp = NULL;

	error = 0;

	goto clean;
syerr:
	error = errno;
clean:
	free(g);
	free(T);
	free(B_z);
	free(B_k);

	return error;
}